

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_client_chop_write(connectdata *conn,int type,char *ptr,size_t len)

{
  int *piVar1;
  Curl_easy *data;
  size_t sVar2;
  char *pcVar3;
  curl_write_callback p_Var4;
  curl_write_callback p_Var5;
  size_t sVar6;
  CURLcode CVar7;
  bool bVar8;
  bool bVar9;
  
  CVar7 = CURLE_OK;
  if (len != 0) {
    data = conn->data;
    if (((data->req).keepon & 0x10) == 0) {
      if ((type & 1U) == 0) {
        p_Var4 = (curl_write_callback)0x0;
      }
      else {
        p_Var4 = (data->set).fwrite_func;
      }
      if ((type & 2U) == 0) {
        p_Var5 = (curl_write_callback)0x0;
      }
      else {
        p_Var5 = (data->set).fwrite_header;
        bVar8 = p_Var5 == (curl_write_callback)0x0;
        if (bVar8) {
          bVar9 = (data->set).writeheader == (void *)0x0;
          if (bVar9) {
            p_Var5 = (curl_write_callback)0x0;
          }
          if (!bVar9 && bVar8) {
            p_Var5 = (data->set).fwrite_func;
          }
        }
      }
      do {
        if (len == 0) goto LAB_00113372;
        sVar6 = 0x4000;
        if (len < 0x4000) {
          sVar6 = len;
        }
        if (p_Var4 == (curl_write_callback)0x0) {
LAB_001134b4:
          if (p_Var5 != (curl_write_callback)0x0) {
            sVar2 = (*p_Var5)(ptr,1,sVar6,(data->set).writeheader);
            if (sVar2 == 0x10000001) {
              pcVar3 = (char *)(*Curl_cmalloc)(len);
              CVar7 = CURLE_OK;
              if (pcVar3 == (char *)0x0) {
                CVar7 = CURLE_OUT_OF_MEMORY;
              }
              else {
                memcpy(pcVar3,ptr,len);
                (data->state).tempwrite = pcVar3;
                (data->state).tempwritesize = len;
                (data->state).tempwritetype = 2;
                piVar1 = &(data->req).keepon;
                *(byte *)piVar1 = (byte)*piVar1 | 0x10;
              }
              bVar8 = false;
            }
            else {
              bVar8 = true;
              if (sVar2 != sVar6) {
                bVar8 = false;
                Curl_failf(data,"Failed writing header");
                CVar7 = CURLE_WRITE_ERROR;
              }
            }
            if (!bVar8) goto LAB_00113568;
          }
          ptr = ptr + sVar6;
          len = len - sVar6;
          bVar8 = true;
        }
        else {
          sVar2 = (*p_Var4)(ptr,1,sVar6,(data->set).out);
          if (sVar2 == 0x10000001) {
            if ((conn->handler->flags & 0x10) == 0) {
              pcVar3 = (char *)(*Curl_cmalloc)(len);
              CVar7 = CURLE_OK;
              if (pcVar3 == (char *)0x0) {
                CVar7 = CURLE_OUT_OF_MEMORY;
              }
              else {
                memcpy(pcVar3,ptr,len);
                (data->state).tempwrite = pcVar3;
                (data->state).tempwritesize = len;
                (data->state).tempwritetype = type;
                piVar1 = &(data->req).keepon;
                *(byte *)piVar1 = (byte)*piVar1 | 0x10;
              }
              bVar8 = false;
            }
            else {
              Curl_failf(data,"Write callback asked for PAUSE when not supported!");
LAB_00113490:
              bVar8 = false;
              CVar7 = CURLE_WRITE_ERROR;
            }
          }
          else {
            bVar8 = true;
            if (sVar2 != sVar6) {
              Curl_failf(data,"Failed writing body (%zu != %zu)",sVar2,sVar6);
              goto LAB_00113490;
            }
          }
          if (bVar8) goto LAB_001134b4;
LAB_00113568:
          bVar8 = false;
        }
      } while (bVar8);
    }
    else {
      CVar7 = CURLE_RECV_ERROR;
      if ((data->state).tempwritetype == type) {
        sVar6 = (data->state).tempwritesize + len;
        pcVar3 = (char *)(*Curl_crealloc)((data->state).tempwrite,sVar6);
        if (pcVar3 == (char *)0x0) {
          CVar7 = CURLE_OUT_OF_MEMORY;
        }
        else {
          memcpy(pcVar3 + (data->state).tempwritesize,ptr,len);
          (data->state).tempwrite = pcVar3;
          (data->state).tempwritesize = sVar6;
LAB_00113372:
          CVar7 = CURLE_OK;
        }
      }
    }
  }
  return CVar7;
}

Assistant:

CURLcode Curl_client_chop_write(struct connectdata *conn,
                                int type,
                                char *ptr,
                                size_t len)
{
  struct Curl_easy *data = conn->data;
  curl_write_callback writeheader = NULL;
  curl_write_callback writebody = NULL;

  if(!len)
    return CURLE_OK;

  /* If reading is actually paused, we're forced to append this chunk of data
     to the already held data, but only if it is the same type as otherwise it
     can't work and it'll return error instead. */
  if(data->req.keepon & KEEP_RECV_PAUSE) {
    size_t newlen;
    char *newptr;
    if(type != data->state.tempwritetype)
      /* major internal confusion */
      return CURLE_RECV_ERROR;

    DEBUGASSERT(data->state.tempwrite);

    /* figure out the new size of the data to save */
    newlen = len + data->state.tempwritesize;
    /* allocate the new memory area */
    newptr = realloc(data->state.tempwrite, newlen);
    if(!newptr)
      return CURLE_OUT_OF_MEMORY;
    /* copy the new data to the end of the new area */
    memcpy(newptr + data->state.tempwritesize, ptr, len);
    /* update the pointer and the size */
    data->state.tempwrite = newptr;
    data->state.tempwritesize = newlen;
    return CURLE_OK;
  }

  /* Determine the callback(s) to use. */
  if(type & CLIENTWRITE_BODY)
    writebody = data->set.fwrite_func;
  if((type & CLIENTWRITE_HEADER) &&
     (data->set.fwrite_header || data->set.writeheader)) {
    /*
     * Write headers to the same callback or to the especially setup
     * header callback function (added after version 7.7.1).
     */
    writeheader =
      data->set.fwrite_header? data->set.fwrite_header: data->set.fwrite_func;
  }

  /* Chop data, write chunks. */
  while(len) {
    size_t chunklen = len <= CURL_MAX_WRITE_SIZE? len: CURL_MAX_WRITE_SIZE;

    if(writebody) {
      size_t wrote = writebody(ptr, 1, chunklen, data->set.out);

      if(CURL_WRITEFUNC_PAUSE == wrote) {
        if(conn->handler->flags & PROTOPT_NONETWORK) {
          /* Protocols that work without network cannot be paused. This is
             actually only FILE:// just now, and it can't pause since the
             transfer isn't done using the "normal" procedure. */
          failf(data, "Write callback asked for PAUSE when not supported!");
          return CURLE_WRITE_ERROR;
        }
        else
          return pausewrite(data, type, ptr, len);
      }
      else if(wrote != chunklen) {
        failf(data, "Failed writing body (%zu != %zu)", wrote, chunklen);
        return CURLE_WRITE_ERROR;
      }
    }

    if(writeheader) {
      size_t wrote = writeheader(ptr, 1, chunklen, data->set.writeheader);

      if(CURL_WRITEFUNC_PAUSE == wrote)
        /* here we pass in the HEADER bit only since if this was body as well
           then it was passed already and clearly that didn't trigger the
           pause, so this is saved for later with the HEADER bit only */
        return pausewrite(data, CLIENTWRITE_HEADER, ptr, len);

      if(wrote != chunklen) {
        failf(data, "Failed writing header");
        return CURLE_WRITE_ERROR;
      }
    }

    ptr += chunklen;
    len -= chunklen;
  }

  return CURLE_OK;
}